

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal.c
# Opt level: O3

void stealamulet(monst *mtmp)

{
  boolean bVar1;
  short sVar2;
  short sVar3;
  char *pcVar4;
  char *pcVar5;
  obj **ppoVar6;
  
  if ((u.uhave._0_1_ & 1) == 0) {
    if (((u.uhave._0_1_ & 0x10) != 0) &&
       (sVar3 = mtmp->mnum, sVar2 = quest_info(0x20), sVar3 == sVar2)) {
      ppoVar6 = &invent;
      do {
        ppoVar6 = &((obj *)ppoVar6)->nobj->nobj;
        if ((obj *)ppoVar6 == (obj *)0x0) {
          return;
        }
        bVar1 = is_quest_artifact((obj *)ppoVar6);
      } while (bVar1 == '\0');
      goto LAB_00257136;
    }
    ppoVar6 = &invent->nobj;
    if ((u.uhave._0_1_ & 2) == 0) {
      sVar2 = 0x1bd;
      sVar3 = 0;
      if (((u.uhave._0_1_ & 4) == 0) && (sVar2 = 0x10b, sVar3 = 0, (u.uhave._0_1_ & 8) == 0)) {
        return;
      }
    }
    else {
      sVar3 = 0x104;
      sVar2 = 0x10c;
    }
  }
  else {
    sVar3 = 0xd8;
    sVar2 = 0xd9;
    ppoVar6 = &invent->nobj;
  }
  while( true ) {
    if ((obj *)ppoVar6 == (obj *)0x0) {
      return;
    }
    if ((sVar2 == ((obj *)ppoVar6)->otyp) ||
       ((sVar3 == ((obj *)ppoVar6)->otyp && ((mtmp->field_0x63 & 0x20) == 0)))) break;
    ppoVar6 = &((obj *)ppoVar6)->nobj->nobj;
  }
LAB_00257136:
  if (((obj *)ppoVar6)->owornmask != 0) {
    remove_worn_item((obj *)ppoVar6,'\x01');
  }
  freeinv((obj *)ppoVar6);
  mpickobj(mtmp,(obj *)ppoVar6);
  pcVar4 = Monnam(mtmp);
  pcVar5 = doname((obj *)ppoVar6);
  pline("%s stole %s!",pcVar4,pcVar5);
  if ((mtmp->data->mflags1 & 0x2000000) == 0) {
    return;
  }
  bVar1 = tele_restrict(mtmp);
  if (bVar1 != '\0') {
    return;
  }
  rloc(level,mtmp,'\0');
  return;
}

Assistant:

void stealamulet(struct monst *mtmp)
{
    struct obj *otmp = NULL;
    int real=0, fake=0;

    /* select the artifact to steal */
    if (u.uhave.amulet) {
	real = AMULET_OF_YENDOR;
	fake = FAKE_AMULET_OF_YENDOR;
    } else if (u.uhave.questart && mtmp->mnum == quest_info(MS_NEMESIS)) {
	for (otmp = invent; otmp; otmp = otmp->nobj)
	    if (is_quest_artifact(otmp)) break;
	if (!otmp) return;	/* should we panic instead? */
    } else if (u.uhave.bell) {
	real = BELL_OF_OPENING;
	fake = BELL;
    } else if (u.uhave.book) {
	real = SPE_BOOK_OF_THE_DEAD;
    } else if (u.uhave.menorah) {
	real = CANDELABRUM_OF_INVOCATION;
    } else return;	/* you have nothing of special interest */

    if (!otmp) {
	/* If we get here, real and fake have been set up. */
	for (otmp = invent; otmp; otmp = otmp->nobj)
	    if (otmp->otyp == real || (otmp->otyp == fake && !mtmp->iswiz))
		break;
    }

    if (otmp) { /* we have something to snatch */
	if (otmp->owornmask)
	    remove_worn_item(otmp, TRUE);
	freeinv(otmp);
	/* mpickobj wont merge otmp because none of the above things
	   to steal are mergable */
	mpickobj(mtmp,otmp);	/* may merge and free otmp */
	pline("%s stole %s!", Monnam(mtmp), doname(otmp));
	if (can_teleport(mtmp->data) && !tele_restrict(mtmp))
	    rloc(level, mtmp, FALSE);
    }
}